

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

isminetype __thiscall wallet::LegacyDataSPKM::IsMine(LegacyDataSPKM *this,CScript *script)

{
  long lVar1;
  IsMineResult IVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IVar2 = anon_unknown_1::IsMineInner(this,script,TOP,true);
  if (INVALID < IVar2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0xe8,"virtual isminetype wallet::LegacyDataSPKM::IsMine(const CScript &) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(isminetype *)(&DAT_00852da0 + (ulong)IVar2 * 4);
  }
  __stack_chk_fail();
}

Assistant:

isminetype LegacyDataSPKM::IsMine(const CScript& script) const
{
    switch (IsMineInner(*this, script, IsMineSigVersion::TOP)) {
    case IsMineResult::INVALID:
    case IsMineResult::NO:
        return ISMINE_NO;
    case IsMineResult::WATCH_ONLY:
        return ISMINE_WATCH_ONLY;
    case IsMineResult::SPENDABLE:
        return ISMINE_SPENDABLE;
    }
    assert(false);
}